

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naiveproxy.cpp
# Opt level: O1

void __thiscall naiveproxy::~naiveproxy(naiveproxy *this)

{
  _List_node_base *p_Var1;
  list<naiveconfig_*,_std::allocator<naiveconfig_*>_> *plVar2;
  _List_node_base *p_Var3;
  
  if (this->oncefd != -1) {
    close(this->oncefd);
  }
  plVar2 = &this->cfgs;
  for (p_Var3 = (this->cfgs).super__List_base<naiveconfig_*,_std::allocator<naiveconfig_*>_>._M_impl
                ._M_node.super__List_node_base._M_next; p_Var3 != (_List_node_base *)plVar2;
      p_Var3 = p_Var3->_M_next) {
    p_Var1 = p_Var3[1]._M_next;
    if (p_Var1 != (_List_node_base *)0x0) {
      if (*(_List_node_base **)((long)(p_Var1 + 1) + 8) !=
          (_List_node_base *)((long)(p_Var1 + 2) + 8U)) {
        operator_delete(*(_List_node_base **)((long)(p_Var1 + 1) + 8));
      }
      operator_delete(p_Var1);
    }
  }
  p_Var3 = (plVar2->super__List_base<naiveconfig_*,_std::allocator<naiveconfig_*>_>)._M_impl._M_node
           .super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)plVar2) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var1;
  }
  return;
}

Assistant:

naiveproxy::~naiveproxy()
{
    //printf("destructor\n");
    //关闭打开文件
    if (oncefd != -1)
        close(oncefd);

    for (auto it = cfgs.begin(); it != cfgs.end(); it++)
    {
        delete *it;
    }
}